

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool qIntegerConversionFromFPHelper<qfloat16,unsigned_short>(qfloat16 from,unsigned_short *to)

{
  undefined2 *in_RSI;
  long in_FS_OFFSET;
  float fVar1;
  double dVar2;
  double fromD;
  qint64 result;
  qfloat16 *in_stack_ffffffffffffffd0;
  bool local_19;
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar1 = qfloat16::operator_cast_to_float(in_stack_ffffffffffffffd0);
  dVar2 = (double)fVar1;
  local_19 = qt_is_nan(1.88577248406658e-317);
  if (local_19) {
    *in_RSI = 0;
  }
  else {
    local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
    dVar2 = round(dVar2);
    anon_unknown.dwarf_643d2e::convertDoubleTo<long_long>(dVar2,(longlong *)local_18,true);
    *in_RSI = (short)local_18[0];
  }
  local_19 = !local_19;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

static bool qIntegerConversionFromFPHelper(From from, To *to)
{
#ifndef Q_CC_GHS
    // actually is_floating_point, but include qfloat16:
    static_assert(std::numeric_limits<From>::is_iec559);
#endif
    static_assert(std::is_integral_v<To>);
    static_assert(sizeof(From) <= sizeof(double));
    const double fromD = static_cast<double>(from);

    if (qt_is_nan(fromD)) {
        *to = To(0);
        return false;
    }

    qint64 result;
    convertDoubleTo(std::round(fromD), &result);
    *to = To(result);
    return true;
}